

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

int Abc_NtkDeriveFlatGiaSop(Gia_Man_t *pGia,int *gFanins,char *pSop)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iLit1;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  
  uVar2 = Abc_SopGetVarNum(pSop);
  iVar3 = Abc_SopIsExorType(pSop);
  if (iVar3 != 0) {
    uVar5 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = uVar5;
    }
    iVar3 = 0;
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = Gia_ManHashXor(pGia,iVar3,gFanins[uVar5]);
    }
LAB_006b3a7e:
    iVar4 = Abc_SopIsComplement(pSop);
    if (iVar4 == 0) {
      return iVar3;
    }
    iVar3 = Abc_LitNot(iVar3);
    return iVar3;
  }
  iVar3 = 0;
  pcVar6 = pSop;
LAB_006b3a04:
  cVar1 = *pcVar6;
  if (cVar1 != '\0') {
    lVar8 = 0;
    iVar4 = 1;
    do {
      if (cVar1 == '0') {
        iLit1 = Abc_LitNot(gFanins[lVar8]);
LAB_006b3a38:
        iVar4 = Gia_ManHashAnd(pGia,iVar4,iLit1);
      }
      else {
        if (cVar1 == '1') {
          iLit1 = gFanins[lVar8];
          goto LAB_006b3a38;
        }
        if ((cVar1 == '\0') || (cVar1 == ' ')) goto LAB_006b3a4e;
      }
      cVar1 = pcVar6[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while( true );
  }
  goto LAB_006b3a7e;
LAB_006b3a4e:
  iVar3 = Abc_LitNot(iVar3);
  iVar4 = Abc_LitNot(iVar4);
  iVar3 = Gia_ManHashAnd(pGia,iVar3,iVar4);
  iVar3 = Abc_LitNot(iVar3);
  pcVar6 = pcVar6 + (int)(uVar2 + 3);
  goto LAB_006b3a04;
}

Assistant:

int Abc_NtkDeriveFlatGiaSop( Gia_Man_t * pGia, int * gFanins, char * pSop )
{
    char * pCube;
    int gAnd, gSum;
    int i, Value, nFanins;
    // get the number of variables
    nFanins = Abc_SopGetVarNum(pSop);
    if ( Abc_SopIsExorType(pSop) )
    {
        gSum = 0; 
        for ( i = 0; i < nFanins; i++ )
            gSum = Gia_ManHashXor( pGia, gSum, gFanins[i] );
    }
    else
    {
        // go through the cubes of the node's SOP
        gSum = 0; 
        Abc_SopForEachCube( pSop, nFanins, pCube )
        {
            // create the AND of literals
            gAnd = 1;
            Abc_CubeForEachVar( pCube, Value, i )
            {
                if ( Value == '1' )
                    gAnd = Gia_ManHashAnd( pGia, gAnd, gFanins[i] );
                else if ( Value == '0' )
                    gAnd = Gia_ManHashAnd( pGia, gAnd, Abc_LitNot(gFanins[i]) );
            }
            // add to the sum of cubes
            gSum = Gia_ManHashAnd( pGia, Abc_LitNot(gSum), Abc_LitNot(gAnd) );
            gSum = Abc_LitNot( gSum );
        }
    }
    // decide whether to complement the result
    if ( Abc_SopIsComplement(pSop) )
        gSum = Abc_LitNot(gSum);
    return gSum;
}